

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.cc
# Opt level: O1

bool __thiscall State::AddDefault(State *this,StringPiece path,string *err)

{
  pointer *pppNVar1;
  iterator __position;
  Node *pNVar2;
  long *plVar3;
  long *plVar4;
  Node *node;
  undefined1 *local_98;
  undefined8 local_90;
  undefined1 local_88;
  undefined7 uStack_87;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  Node *local_58;
  long *local_50;
  long local_48;
  long local_40;
  long lStack_38;
  
  pNVar2 = LookupNode(this,path);
  local_58 = pNVar2;
  if (pNVar2 == (Node *)0x0) {
    local_98 = &local_88;
    if (path.len_ == 0) {
      local_90 = 0;
      local_88 = 0;
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_98,path.str_,path.str_ + path.len_);
    }
    plVar3 = (long *)std::__cxx11::string::replace((ulong)&local_98,0,(char *)0x0,0x121d54);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_68 = *plVar4;
      lStack_60 = plVar3[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar4;
      local_78 = (long *)*plVar3;
    }
    local_70 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    plVar3 = (long *)std::__cxx11::string::append((char *)&local_78);
    plVar4 = plVar3 + 2;
    if ((long *)*plVar3 == plVar4) {
      local_40 = *plVar4;
      lStack_38 = plVar3[3];
      local_50 = &local_40;
    }
    else {
      local_40 = *plVar4;
      local_50 = (long *)*plVar3;
    }
    local_48 = plVar3[1];
    *plVar3 = (long)plVar4;
    plVar3[1] = 0;
    *(undefined1 *)(plVar3 + 2) = 0;
    std::__cxx11::string::operator=((string *)err,(string *)&local_50);
    if (local_50 != &local_40) {
      operator_delete(local_50,local_40 + 1);
    }
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if (local_98 != &local_88) {
      operator_delete(local_98,CONCAT71(uStack_87,local_88) + 1);
    }
  }
  else {
    __position._M_current =
         (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<Node*,std::allocator<Node*>>::_M_realloc_insert<Node*const&>
                ((vector<Node*,std::allocator<Node*>> *)&this->defaults_,__position,&local_58);
    }
    else {
      *__position._M_current = pNVar2;
      pppNVar1 = &(this->defaults_).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      *pppNVar1 = *pppNVar1 + 1;
    }
  }
  return pNVar2 != (Node *)0x0;
}

Assistant:

bool State::AddDefault(StringPiece path, string* err) {
  Node* node = LookupNode(path);
  if (!node) {
    *err = "unknown target '" + path.AsString() + "'";
    return false;
  }
  defaults_.push_back(node);
  return true;
}